

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxConcat::Emit(FxConcat *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  PType *pPVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ExpEmit EVar7;
  ExpEmit EVar8;
  int iVar9;
  char cVar10;
  ExpEmit EVar11;
  VM_SHALF opbc;
  ExpEmit EVar12;
  ExpEmit EVar13;
  VM_SHALF local_68;
  ExpEmit local_58;
  ExpEmit local_50;
  FxConcat *local_48;
  ExpEmit op2;
  ExpEmit op1;
  uint extraout_var;
  uint extraout_var_00;
  
  EVar7._0_4_ = (*((this->super_FxBinary).left)->_vptr_FxExpression[9])();
  EVar7.Konst = (bool)(char)extraout_var;
  EVar7.Fixed = (bool)(char)(extraout_var >> 8);
  EVar7.Final = (bool)(char)(extraout_var >> 0x10);
  EVar7.Target = (bool)(char)(extraout_var >> 0x18);
  pFVar1 = (this->super_FxBinary).right;
  local_48 = this;
  op1 = EVar7;
  EVar8._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  EVar8.Konst = (bool)(char)extraout_var_00;
  EVar8.Fixed = (bool)(char)(extraout_var_00 >> 8);
  EVar8.Final = (bool)(char)(extraout_var_00 >> 0x10);
  EVar8.Target = (bool)(char)(extraout_var_00 >> 0x18);
  opbc = (VM_SHALF)EVar7._0_4_;
  cVar10 = (char)(EVar7._0_4_ >> 0x10);
  op2 = EVar8;
  if (cVar10 == '\x02') {
    local_50 = EVar7;
    if ((extraout_var & 1) != 0) {
      EVar7._0_4_ = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
      local_50.Konst = false;
      local_50.Fixed = false;
      local_50.Final = false;
      local_50.Target = false;
      local_50._0_4_ = (EVar7._0_4_ & 0xffff) + 0x1020000;
      VMFunctionBuilder::Emit(build,4,EVar7._0_4_ & 0xffff,opbc);
    }
  }
  else {
    uVar6 = 1;
    uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
    local_50._0_4_ = uVar4 & 0xffff | 0x1020000;
    local_50.Konst = false;
    local_50.Fixed = false;
    local_50.Final = false;
    local_50.Target = false;
    if ((extraout_var & 1) == 0) {
      cVar3 = (char)(EVar7._0_4_ >> 0x18);
      EVar12 = EVar7;
    }
    else {
      uVar5 = VMFunctionBuilder::RegAvailability::Get
                        (build->Registers + (((ulong)EVar7._0_4_ & 0xff0000) >> 0x10),1);
      EVar12.Konst = false;
      EVar12.Fixed = false;
      EVar12.Final = false;
      EVar12.Target = false;
      EVar12.RegNum = (short)uVar5;
      EVar12.RegType = (char)(uVar5 >> 0x10);
      EVar12.RegCount = (char)(uVar5 >> 0x18);
      iVar9 = (uint)(cVar10 != '\x01') * 2 + 3;
      if (cVar10 == '\0') {
        iVar9 = 2;
      }
      VMFunctionBuilder::Emit(build,iVar9,uVar5 & 0xffff,opbc);
      op1 = (ExpEmit)((ulong)((int)(((ulong)EVar7._0_4_ & 0xff0000) >> 0x10) << 0x10 |
                             uVar5 & 0xffff) | 0x1000000);
      cVar3 = '\x01';
    }
    if (cVar10 == '\x01') {
      uVar6 = cVar3 == '\x02' ^ 0x11;
      if (cVar3 == '\x01') {
        uVar6 = 6;
      }
    }
    else {
      pPVar2 = ((local_48->super_FxBinary).left)->ValueType;
      if (pPVar2 == (PType *)TypeUInt32) {
        uVar6 = 3;
      }
      else if (pPVar2 == (PType *)TypeName) {
        uVar6 = 0xb;
      }
      else if (pPVar2 == (PType *)TypeSound) {
        uVar6 = 0xf;
      }
      else if (pPVar2 == (PType *)TypeColor) {
        uVar6 = 0xe;
      }
      else if (pPVar2 == (PType *)TypeSpriteID) {
        uVar6 = 0x12;
      }
      else if (pPVar2 == (PType *)TypeTextureID) {
        uVar6 = 0x13;
      }
      else if (cVar10 == '\x03') {
        uVar6 = 7;
      }
      else if ((EVar7._0_4_ >> 0x10 & 0xff) != 0) {
        __assert_fail("false && \"Bad type for string concatenation\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0xf9c,"virtual ExpEmit FxConcat::Emit(VMFunctionBuilder *)");
      }
    }
    VMFunctionBuilder::Emit(build,0x3e,uVar4 & 0xffff,EVar12._0_4_ & 0xffff,uVar6);
    ExpEmit::Free(&op1,build);
    EVar7._0_4_ = uVar4;
  }
  cVar10 = (char)(EVar8._0_4_ >> 0x10);
  local_68 = (VM_SHALF)EVar8._0_4_;
  if (cVar10 == '\x02') {
    local_58 = EVar8;
    if ((extraout_var_00 & 1) != 0) {
      EVar8._0_4_ = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
      local_58.Konst = false;
      local_58.Fixed = false;
      local_58.Final = false;
      local_58.Target = false;
      local_58._0_4_ = (EVar8._0_4_ & 0xffff) + 0x1020000;
      VMFunctionBuilder::Emit(build,4,EVar8._0_4_ & 0xffff,local_68);
    }
  }
  else {
    uVar6 = 1;
    uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
    local_58._0_4_ = uVar4 & 0xffff | 0x1020000;
    local_58.Konst = false;
    local_58.Fixed = false;
    local_58.Final = false;
    local_58.Target = false;
    if ((extraout_var_00 & 1) == 0) {
      cVar3 = (char)(EVar8._0_4_ >> 0x18);
      EVar11 = EVar8;
    }
    else {
      uVar5 = VMFunctionBuilder::RegAvailability::Get
                        (build->Registers + (((ulong)EVar8._0_4_ & 0xff0000) >> 0x10),1);
      iVar9 = (uint)(cVar10 != '\x01') * 2 + 3;
      if (cVar10 == '\0') {
        iVar9 = 2;
      }
      VMFunctionBuilder::Emit(build,iVar9,uVar5 & 0xffff,local_68);
      op2 = (ExpEmit)((ulong)((int)(((ulong)EVar8._0_4_ & 0xff0000) >> 0x10) << 0x10 |
                             uVar5 & 0xffff) | 0x1000000);
      cVar3 = '\x01';
      EVar11.Konst = false;
      EVar11.Fixed = false;
      EVar11.Final = false;
      EVar11.Target = false;
      EVar11.RegNum = (short)uVar5;
      EVar11.RegType = (char)(uVar5 >> 0x10);
      EVar11.RegCount = (char)(uVar5 >> 0x18);
    }
    if (cVar10 == '\x01') {
      uVar6 = cVar3 == '\x02' ^ 0x11;
      if (cVar3 == '\x01') {
        uVar6 = 6;
      }
    }
    else {
      pPVar2 = ((local_48->super_FxBinary).right)->ValueType;
      if (pPVar2 == (PType *)TypeUInt32) {
        uVar6 = 3;
      }
      else if (pPVar2 == (PType *)TypeName) {
        uVar6 = 0xb;
      }
      else if (pPVar2 == (PType *)TypeSound) {
        uVar6 = 0xf;
      }
      else if (pPVar2 == (PType *)TypeColor) {
        uVar6 = 0xe;
      }
      else if (pPVar2 == (PType *)TypeSpriteID) {
        uVar6 = 0x12;
      }
      else if (pPVar2 == (PType *)TypeTextureID) {
        uVar6 = 0x13;
      }
      else if (cVar10 == '\x03') {
        uVar6 = 7;
      }
      else if ((EVar8._0_4_ & 0xff0000) != 0) {
        __assert_fail("false && \"Bad type for string concatenation\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0xfbd,"virtual ExpEmit FxConcat::Emit(VMFunctionBuilder *)");
      }
    }
    VMFunctionBuilder::Emit(build,0x3e,uVar4 & 0xffff,EVar11._0_4_ & 0xffff,uVar6);
    ExpEmit::Free(&op2,build);
    EVar8._0_4_ = uVar4;
  }
  ExpEmit::Free(&local_50,build);
  ExpEmit::Free(&local_58,build);
  uVar6 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
  VMFunctionBuilder::Emit(build,0x57,uVar6 & 0xffff,EVar7._0_4_ & 0xffff,EVar8._0_4_ & 0xffff);
  EVar13._0_4_ = uVar6 & 0xffff | 0x1020000;
  EVar13.Konst = false;
  EVar13.Fixed = false;
  EVar13.Final = false;
  EVar13.Target = false;
  return EVar13;
}

Assistant:

ExpEmit FxConcat::Emit(VMFunctionBuilder *build)
{
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);
	ExpEmit strng, strng2;

	if (op1.RegType == REGT_STRING && op1.Konst)
	{
		strng = ExpEmit(build, REGT_STRING);
		build->Emit(OP_LKS, strng.RegNum, op1.RegNum);
	}
	else if (op1.RegType == REGT_STRING)
	{
		strng = op1;
	}
	else
	{
		int cast;
		strng = ExpEmit(build, REGT_STRING);
		if (op1.Konst)
		{
			ExpEmit nonconst(build, op1.RegType);
			build->Emit(op1.RegType == REGT_INT ? OP_LK : op1.RegType == REGT_FLOAT ? OP_LKF : OP_LKP, nonconst.RegNum, op1.RegNum);
			op1 = nonconst;
		}
		if (op1.RegType == REGT_FLOAT) cast = op1.RegCount == 1 ? CAST_F2S : op1.RegCount == 2 ? CAST_V22S : CAST_V32S;
		else if (left->ValueType == TypeUInt32) cast = CAST_U2S;
		else if (left->ValueType == TypeName) cast = CAST_N2S;
		else if (left->ValueType == TypeSound) cast = CAST_So2S;
		else if (left->ValueType == TypeColor) cast = CAST_Co2S;
		else if (left->ValueType == TypeSpriteID) cast = CAST_SID2S;
		else if (left->ValueType == TypeTextureID) cast = CAST_TID2S;
		else if (op1.RegType == REGT_POINTER) cast = CAST_P2S;
		else if (op1.RegType == REGT_INT) cast = CAST_I2S;
		else assert(false && "Bad type for string concatenation");
		build->Emit(OP_CAST, strng.RegNum, op1.RegNum, cast);
		op1.Free(build);
	}

	if (op2.RegType == REGT_STRING && op2.Konst)
	{
		strng2 = ExpEmit(build, REGT_STRING);
		build->Emit(OP_LKS, strng2.RegNum, op2.RegNum);
	}
	else if (op2.RegType == REGT_STRING)
	{
		strng2 = op2;
	}
	else
	{
		int cast;
		strng2 = ExpEmit(build, REGT_STRING);
		if (op2.Konst)
		{
			ExpEmit nonconst(build, op2.RegType);
			build->Emit(op2.RegType == REGT_INT ? OP_LK : op2.RegType == REGT_FLOAT ? OP_LKF : OP_LKP, nonconst.RegNum, op2.RegNum);
			op2 = nonconst;
		}
		if (op2.RegType == REGT_FLOAT) cast = op2.RegCount == 1 ? CAST_F2S : op2.RegCount == 2 ? CAST_V22S : CAST_V32S;
		else if (right->ValueType == TypeUInt32) cast = CAST_U2S;
		else if (right->ValueType == TypeName) cast = CAST_N2S;
		else if (right->ValueType == TypeSound) cast = CAST_So2S;
		else if (right->ValueType == TypeColor) cast = CAST_Co2S;
		else if (right->ValueType == TypeSpriteID) cast = CAST_SID2S;
		else if (right->ValueType == TypeTextureID) cast = CAST_TID2S;
		else if (op2.RegType == REGT_POINTER) cast = CAST_P2S;
		else if (op2.RegType == REGT_INT) cast = CAST_I2S;
		else assert(false && "Bad type for string concatenation");
		build->Emit(OP_CAST, strng2.RegNum, op2.RegNum, cast);
		op2.Free(build);
	}
	strng.Free(build);
	strng2.Free(build);
	ExpEmit dest(build, REGT_STRING);
	assert(strng.RegType == strng2.RegType && strng.RegType == REGT_STRING);
	build->Emit(OP_CONCAT, dest.RegNum, strng.RegNum, strng2.RegNum);
	return dest;
}